

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O0

int vx__plane_box_overlap(vx_vertex_t *normal,float d,vx_vertex_t *halfboxsize)

{
  float fVar1;
  int local_44;
  undefined1 local_40 [4];
  int dim;
  vx_vertex_t vmax;
  vx_vertex_t vmin;
  vx_vertex_t *halfboxsize_local;
  float d_local;
  vx_vertex_t *normal_local;
  
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    if ((normal->field_0).v[local_44] <= 0.0) {
      *(float *)((long)&vmax.field_0 + (long)local_44 * 4 + 4) = (halfboxsize->field_0).v[local_44];
      *(float *)(local_40 + (long)local_44 * 4) = -(halfboxsize->field_0).v[local_44];
    }
    else {
      *(float *)((long)&vmax.field_0 + (long)local_44 * 4 + 4) = -(halfboxsize->field_0).v[local_44]
      ;
      *(float *)(local_40 + (long)local_44 * 4) = (halfboxsize->field_0).v[local_44];
    }
  }
  fVar1 = vx__vertex_dot(normal,(vx_vertex_t *)((long)&vmax.field_0 + 4));
  if (fVar1 + d <= 0.0) {
    fVar1 = vx__vertex_dot(normal,(vx_vertex_t *)local_40);
    if (fVar1 + d < 0.0) {
      normal_local._4_4_ = 0;
    }
    else {
      normal_local._4_4_ = 1;
    }
  }
  else {
    normal_local._4_4_ = 0;
  }
  return normal_local._4_4_;
}

Assistant:

int vx__plane_box_overlap(vx_vertex_t* normal,
    float d,
    vx_vertex_t* halfboxsize)
{
    vx_vertex_t vmin, vmax;

    for (int dim = 0; dim <= 2; dim++) {
        if (normal->v[dim] > 0.0f) {
            vmin.v[dim] = -halfboxsize->v[dim];
            vmax.v[dim] = halfboxsize->v[dim];
        } else {
            vmin.v[dim] = halfboxsize->v[dim];
            vmax.v[dim] = -halfboxsize->v[dim];
        }
    }

    if (vx__vertex_dot(normal, &vmin) + d > 0.0f) {
        return false;
    }

    if (vx__vertex_dot(normal, &vmax) + d >= 0.0f) {
        return true;
    }

    return false;
}